

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

void __thiscall
tinyusdz::TypedTimeSamples<tinyusdz::Extent>::add_sample
          (TypedTimeSamples<tinyusdz::Extent> *this,double t,Extent *v)

{
  pointer *ppSVar1;
  iterator __position;
  Sample local_30;
  
  local_30.blocked = false;
  local_30.value.upper._M_elems._4_8_ = *(undefined8 *)((v->upper)._M_elems + 1);
  local_30.value.lower._M_elems._0_8_ = *(undefined8 *)(v->lower)._M_elems;
  local_30.value._8_8_ = *(undefined8 *)((v->lower)._M_elems + 2);
  __position._M_current =
       (this->_samples).
       super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_samples).
      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_30.t = t;
    ::std::
    vector<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>>
    ::_M_realloc_insert<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample&>
              ((vector<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>>
                *)this,__position,&local_30);
  }
  else {
    *(ulong *)&(__position._M_current)->blocked = (ulong)(uint7)local_30._33_7_ << 8;
    *(undefined8 *)(((__position._M_current)->value).lower._M_elems + 2) = local_30.value._8_8_;
    *(undefined8 *)(((__position._M_current)->value).upper._M_elems + 1) =
         local_30.value.upper._M_elems._4_8_;
    (__position._M_current)->t = t;
    *(undefined8 *)((__position._M_current)->value).lower._M_elems =
         local_30.value.lower._M_elems._0_8_;
    ppSVar1 = &(this->_samples).
               super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  this->_dirty = true;
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }